

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_test.c
# Opt level: O0

bool_t hexTest(void)

{
  bool_t bVar1;
  int iVar2;
  octet *poVar3;
  size_t count;
  char hex1 [513];
  char hex [513];
  octet buf [256];
  char *in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  char *in_stack_fffffffffffffab8;
  char *in_stack_fffffffffffffac0;
  ulong local_530;
  char local_318 [528];
  char local_108 [264];
  
  bVar1 = hexIsValid(in_stack_fffffffffffffaa8);
  if ((((bVar1 == 0) || (bVar1 = hexIsValid(in_stack_fffffffffffffaa8), bVar1 != 0)) ||
      (bVar1 = hexIsValid(in_stack_fffffffffffffaa8), bVar1 == 0)) ||
     (bVar1 = hexIsValid(in_stack_fffffffffffffaa8), bVar1 != 0)) {
    return 0;
  }
  local_530 = 0;
  while( true ) {
    if (0x100 < local_530) {
      return 1;
    }
    beltH();
    hexFrom(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,0x1047a9);
    beltH();
    bVar1 = hexEq(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    if (bVar1 == 0) {
      return 0;
    }
    hexTo(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    in_stack_fffffffffffffac0 = local_108;
    poVar3 = beltH();
    bVar1 = memEq(in_stack_fffffffffffffac0,poVar3,local_530);
    if (bVar1 == 0) {
      return 0;
    }
    in_stack_fffffffffffffab8 = local_318;
    beltH();
    hexFromRev(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,0x10484b);
    beltH();
    bVar1 = hexEqRev(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    if (bVar1 == 0) break;
    hexToRev(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    in_stack_fffffffffffffab0 = local_108;
    poVar3 = beltH();
    bVar1 = memEq(in_stack_fffffffffffffab0,poVar3,local_530);
    if (bVar1 == 0) {
      return 0;
    }
    memCopy(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,0x1048db);
    hexLower(in_stack_fffffffffffffab0);
    hexUpper(in_stack_fffffffffffffab0);
    iVar2 = strCmp(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    if (iVar2 != 0) {
      return 0;
    }
    local_530 = local_530 + 1;
  }
  return 0;
}

Assistant:

bool_t hexTest()
{
	octet buf[256];
	char hex[512 + 1];
	char hex1[512 + 1];
	size_t count;
	// валидация
	if (!hexIsValid("1234") ||
		hexIsValid("12345") ||
		!hexIsValid("ABCDEFabcdef") ||
		hexIsValid("abcdefgh"))
		return FALSE;
	// кодировать / декодировать
	for (count = 0; count <= 256; ++count)
	{
		hexFrom(hex, beltH(), count);
		if (!hexEq(beltH(), hex))
			return FALSE;
		hexTo(buf, hex);
		if (!memEq(buf, beltH(), count))
			return FALSE;
		hexFromRev(hex, beltH(), count);
		if (!hexEqRev(beltH(), hex))
			return FALSE;
		hexToRev(buf, hex);
		if (!memEq(buf, beltH(), count))
			return FALSE;
		memCopy(hex1, hex, sizeof(hex));
		hexLower(hex1);
		hexUpper(hex1);
		if (!strEq(hex, hex1))
			return FALSE;
	}
	// все нормально
	return TRUE;
}